

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlmodule(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int test_ret;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (quiet == '\0') {
    puts("Testing xmlmodule : 2 of 4 functions ...");
  }
  bVar8 = true;
  iVar3 = 0;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlModuleClose(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlModuleClose");
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar8 = true;
  do {
    if (!bVar8) {
      function_tests = function_tests + 1;
      uVar5 = iVar1 - iVar3;
      if (uVar5 != 0) {
        printf("Module xmlmodule: %d errors\n",(ulong)uVar5);
      }
      return uVar5;
    }
    uVar7 = 0;
    while (uVar5 = (uint)uVar7, uVar5 != 4) {
      bVar8 = true;
      while (bVar8) {
        iVar2 = xmlMemBlocks();
        if (uVar5 < 3) {
          uVar6 = (&DAT_0015bd68)[uVar7];
        }
        else {
          uVar6 = 0;
        }
        xmlModuleSymbol(0,uVar6,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar2 == iVar4) break;
        iVar4 = xmlMemBlocks();
        bVar8 = false;
        printf("Leak of %d blocks found in xmlModuleSymbol",(ulong)(uint)(iVar4 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar7 = (ulong)(uVar5 + 1);
    }
    bVar8 = false;
  } while( true );
}

Assistant:

static int
test_xmlmodule(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlmodule : 2 of 4 functions ...\n");
    test_ret += test_xmlModuleClose();
    test_ret += test_xmlModuleOpen();
    test_ret += test_xmlModuleSymbol();

    if (test_ret != 0)
	printf("Module xmlmodule: %d errors\n", test_ret);
    return(test_ret);
}